

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O1

Expr * nivalis::Expr::zero(void)

{
  pointer pAVar1;
  Expr *z;
  Expr *in_RDI;
  
  Expr(in_RDI);
  pAVar1 = (in_RDI->ast).
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pAVar1->opcode = 1;
  (pAVar1->field_1).ref = 0;
  return in_RDI;
}

Assistant:

Expr Expr::constant(double val) {
    Expr z;
    z.ast[0].opcode = OpCode::val;
    z.ast[0].val = val;
    return z;
}